

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::ClearUnderwaterAcousticEmitterBeams
          (UnderwaterAcousticEmitterSystem *this)

{
  UnderwaterAcousticEmitterSystem *this_local;
  
  this->m_ui8EmitterSystemDataLength = '\x05';
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::clear(&this->m_vUAEB);
  this->m_ui8NumBeams = '\0';
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::ClearUnderwaterAcousticEmitterBeams()
{
    m_ui8EmitterSystemDataLength = UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE / 4;
    m_vUAEB.clear();
    m_ui8NumBeams = 0;
}